

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O0

INT Silent_PAL_vsnprintf(LPSTR Buffer,INT Count,LPCSTR Format,__va_list_tag *aparg)

{
  long lVar1;
  void *pvVar2;
  char *__s;
  undefined8 uVar3;
  BOOL BVar4;
  int iVar5;
  int iVar6;
  errno_t eVar7;
  size_t sVar8;
  ulong Count_00;
  long in_FS_OFFSET;
  undefined4 *local_7b8;
  undefined4 *local_7a0;
  undefined8 *local_788;
  undefined4 *local_770;
  undefined8 *local_758;
  undefined8 *local_738;
  INT *local_718;
  INT *local_700;
  undefined4 *local_6e8;
  undefined8 *local_6a0;
  INT *local_670;
  INT *local_640;
  undefined1 auStack_628 [8];
  va_list apcopy;
  short s;
  int n;
  short trunc2;
  long trunc1;
  size_t TempCount;
  char *tempStr;
  undefined1 auStack_5d8 [2];
  char ch [2];
  CHAR TempBuffer [4];
  va_list ap;
  int local_5b0;
  int wctombResult;
  INT TempInt;
  INT Length;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar;
  LPWSTR TempWStr;
  LPCSTR Fmt;
  LPSTR BufferPtr;
  __va_list_tag *p_Stack_570;
  BOOL BufferRanOut;
  __va_list_tag *aparg_local;
  LPCSTR Format_local;
  LPSTR pCStack_558;
  INT Count_local;
  LPSTR Buffer_local;
  CHAR local_548 [8];
  CHAR TempStr [301];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BufferPtr._4_4_ = 0;
  pvVar2 = aparg->reg_save_area;
  _auStack_5d8 = aparg->gp_offset;
  TempBuffer = (CHAR  [4])aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  TempWStr = (LPWSTR)Format;
  Fmt = Buffer;
  p_Stack_570 = aparg;
  aparg_local = (__va_list_tag *)Format;
  Format_local._4_4_ = Count;
  pCStack_558 = Buffer;
  do {
    if ((char)*TempWStr == '\0') {
LAB_0039d9d8:
      if ((long)Fmt - (long)pCStack_558 < (long)Format_local._4_4_) {
        *Fmt = '\0';
      }
      if (BufferPtr._4_4_ == 0) {
        Buffer_local._4_4_ = (int)Fmt - (int)pCStack_558;
      }
      else {
        Buffer_local._4_4_ = -1;
      }
LAB_0039da32:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return Buffer_local._4_4_;
    }
    if ((long)Format_local._4_4_ <= (long)Fmt - (long)pCStack_558) {
      BufferPtr._4_4_ = 1;
      goto LAB_0039d9d8;
    }
    if (((char)*TempWStr == '%') &&
       (BVar4 = Silent_ExtractFormatA
                          ((LPCSTR *)&TempWStr,TempStr + 0x128,&Precision,&Prefix,&Type,&Length,
                           &TempInt), BVar4 == 1)) {
      if ((Length == 2) && (TempInt == 2)) {
        if (Prefix == -2) {
          if (_auStack_5d8 < 0x29) {
            local_640 = (INT *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_640 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_640;
        }
        else if (Prefix == -3) {
          if (_auStack_5d8 < 0x29) {
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (Type == -2) {
          if (_auStack_5d8 < 0x29) {
            local_670 = (INT *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_670 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_670;
        }
        else if (Type == -4) {
          if (_auStack_5d8 < 0x29) {
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (_auStack_5d8 < 0x29) {
          local_6a0 = (undefined8 *)((long)(int)_auStack_5d8 + (long)pvVar2);
          _auStack_5d8 = _auStack_5d8 + 8;
        }
        else {
          local_6a0 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        _Flags = (LPCWSTR)*local_6a0;
        iVar5 = Silent_WideCharToMultiByte(_Flags,-1,(LPSTR)0x0,0);
        if (iVar5 == 0) {
          Buffer_local._4_4_ = -1;
          goto LAB_0039da32;
        }
        if (Type == -3) {
          Type = 300;
        }
        if (Type == -3) {
          local_548[0] = '\0';
          wctombResult = 0;
        }
        else if ((Type < 1) || (iVar5 + -1 <= Type)) {
          iVar6 = Silent_WideCharToMultiByte(_Flags,-1,local_548,iVar5);
          if (iVar6 == 0) {
            PAL_free(local_548);
            Buffer_local._4_4_ = -1;
            goto LAB_0039da32;
          }
          wctombResult = iVar5 + -1;
        }
        else {
          iVar5 = Silent_WideCharToMultiByte(_Flags,Type,local_548,iVar5);
          if (iVar5 == 0) {
            Buffer_local._4_4_ = -1;
            goto LAB_0039da32;
          }
          local_548[iVar5] = '\0';
          wctombResult = Type;
        }
        BVar4 = Internal_AddPaddingA
                          (&Fmt,Format_local._4_4_ - ((int)Fmt - (int)pCStack_558),local_548,
                           Prefix - wctombResult,Precision);
        BufferPtr._4_4_ = (uint)((BVar4 != 0 ^ 0xffU) & 1);
      }
      else if ((Length == 2) && (TempInt == 1)) {
        if ((Prefix == -2) || (Prefix == -3)) {
          if (_auStack_5d8 < 0x29) {
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type == -2) || (Type == -4)) {
          if (_auStack_5d8 < 0x29) {
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (_auStack_5d8 < 0x29) {
          local_6e8 = (undefined4 *)((long)(int)_auStack_5d8 + (long)pvVar2);
          _auStack_5d8 = _auStack_5d8 + 8;
        }
        else {
          local_6e8 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width._2_2_ = (undefined2)*local_6e8;
        iVar5 = Silent_WideCharToMultiByte
                          ((LPCWSTR)((long)&Width + 2),1,(LPSTR)((long)&tempStr + 4),4);
        if (iVar5 == 0) {
          Buffer_local._4_4_ = -1;
          goto LAB_0039da32;
        }
        *(undefined1 *)((long)&tempStr + (long)iVar5 + 4) = 0;
        BVar4 = Internal_AddPaddingA
                          (&Fmt,Format_local._4_4_ - ((int)Fmt - (int)pCStack_558),
                           (LPSTR)((long)&tempStr + 4),Prefix - iVar5,Precision);
        BufferPtr._4_4_ = (uint)((BVar4 != 0 ^ 0xffU) & 1);
      }
      else if (TempInt == 6) {
        if (Prefix == -2) {
          if (_auStack_5d8 < 0x29) {
            local_700 = (INT *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_700 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_700;
        }
        if (Type == -2) {
          if (_auStack_5d8 < 0x29) {
            local_718 = (INT *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_718 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_718;
        }
        if (Length == 1) {
          if (_auStack_5d8 < 0x29) {
            local_738 = (undefined8 *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_738 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*local_738 = (short)Fmt - (short)pCStack_558;
        }
        else {
          if (_auStack_5d8 < 0x29) {
            local_758 = (undefined8 *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_758 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*local_758 = (int)Fmt - (int)pCStack_558;
        }
      }
      else if ((TempInt == 1) && ((Precision & 4U) != 0)) {
        if (_auStack_5d8 < 0x29) {
          local_770 = (undefined4 *)((long)(int)_auStack_5d8 + (long)pvVar2);
          _auStack_5d8 = _auStack_5d8 + 8;
        }
        else {
          local_770 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        tempStr._2_1_ = (undefined1)*local_770;
        tempStr._3_1_ = 0;
        BVar4 = Internal_AddPaddingA
                          (&Fmt,Format_local._4_4_ - ((int)Fmt - (int)pCStack_558),
                           (LPSTR)((long)&tempStr + 2),Prefix + -1,Precision);
        BufferPtr._4_4_ = (uint)((BVar4 != 0 ^ 0xffU) & 1);
      }
      else if ((TempInt == 2) && ((Precision & 4U) != 0)) {
        if (_auStack_5d8 < 0x29) {
          local_788 = (undefined8 *)((long)(int)_auStack_5d8 + (long)pvVar2);
          _auStack_5d8 = _auStack_5d8 + 8;
        }
        else {
          local_788 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        __s = (char *)*local_788;
        sVar8 = strlen(__s);
        BVar4 = Internal_AddPaddingA
                          (&Fmt,Format_local._4_4_ - ((int)Fmt - (int)pCStack_558),__s,
                           Prefix - (int)sVar8,Precision);
        BufferPtr._4_4_ = (uint)((BVar4 != 0 ^ 0xffU) & 1);
      }
      else {
        Count_00 = (long)Format_local._4_4_ - ((long)Fmt - (long)pCStack_558);
        if ((TempInt == 5) && (Length == 1)) {
          if (_auStack_5d8 < 0x29) {
            local_7a0 = (undefined4 *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_7a0 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_5b0 = snprintf(Fmt,Count_00,TempStr + 0x128,(ulong)(uint)(int)(short)*local_7a0);
        }
        else if ((TempInt == 4) && (Length == 1)) {
          if (_auStack_5d8 < 0x29) {
            local_7b8 = (undefined4 *)((long)(int)_auStack_5d8 + (long)pvVar2);
            _auStack_5d8 = _auStack_5d8 + 8;
          }
          else {
            local_7b8 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_5b0 = snprintf(Fmt,Count_00,TempStr + 0x128,(ulong)(uint)(int)(short)*local_7b8);
        }
        else {
          if (((TempStr[0x128] == '%') && (TempStr[0x129] == 's')) &&
             (eVar7 = strcpy_s(TempStr + 0x128,0x400,"%.300s"), eVar7 != 0)) {
            Buffer_local._4_4_ = -1;
            goto LAB_0039da32;
          }
          uVar3 = _auStack_5d8;
          auStack_628._0_4_ = _auStack_5d8;
          auStack_628[4] = TempBuffer[0];
          auStack_628[5] = TempBuffer[1];
          auStack_628[6] = TempBuffer[2];
          auStack_628[7] = TempBuffer[3];
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          apcopy[0].overflow_arg_area = pvVar2;
          _auStack_5d8 = uVar3;
          local_5b0 = PAL__vsnprintf(Fmt,Count_00,TempStr + 0x128,(__va_list_tag *)auStack_628);
          PAL_printf_arg_remover((va_list *)auStack_5d8,Prefix,Type,TempInt,Length);
        }
        if ((local_5b0 < 0) || (Count_00 <= (ulong)(long)local_5b0)) {
          BufferPtr._4_4_ = 1;
        }
        else {
          Count_00 = (ulong)local_5b0;
        }
        Fmt = Fmt + Count_00;
      }
    }
    else {
      *Fmt = (CHAR)*TempWStr;
      TempWStr = (LPWSTR)((long)TempWStr + 1);
      Fmt = Fmt + 1;
    }
  } while( true );
}

Assistant:

INT Silent_PAL_vsnprintf(LPSTR Buffer, INT Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    CHAR TempStr[MAX_STR_LEN+1];
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if ((BufferPtr - Buffer) >= Count)
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }

                /* clip string output to MAX_STR_LEN characters */
                if (PRECISION_DOT == Precision)
                {
                    Precision = MAX_STR_LEN;
                }

                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1,
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            /* types that sprintf can handle */
            else
            {
                size_t TempCount = Count - (BufferPtr - Buffer);

                TempInt = 0;
                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    /* limit string output (%s) to 300 characters */
                    if(TempBuff[0] == '%' && TempBuff[1] == 's')
                    {
                        if (strcpy_s(TempBuff, sizeof(TempBuff), "%.300s") != SAFECRT_SUCCESS)
                        {
                            va_end(ap);
                            return -1;
                        }
                    }                                     
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL__vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (Count > (BufferPtr - Buffer))
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}